

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_string_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  
  uVar3 = id * 2 + 4;
  if ((uVar3 < (uint)td->vsize) &&
     (uVar4 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar3), uVar4 != 0)) {
    puVar5 = (uint *)(uVar4 + (long)td->table);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
    }
    print_name(ctx,name,len);
    puVar5 = (uint *)((long)puVar5 + (ulong)*puVar5);
    print_string(ctx,(char *)(puVar5 + 1),(ulong)*puVar5);
    return;
  }
  return;
}

Assistant:

void flatcc_json_printer_string_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len)
{
    const void *p = get_field_ptr(td, id);

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_string_object(ctx, read_uoffset_ptr(p));
    }
}